

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<unsigned_short>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  SelectionVector *pSVar4;
  ushort uVar5;
  undefined2 uVar6;
  ushort uVar7;
  ulong uVar8;
  idx_t row_idx;
  ushort uVar9;
  data_ptr_t pdVar10;
  bool bVar11;
  
  pdVar2 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar10 = target + target_offset * 2;
    pSVar4 = adata->sel;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      psVar3 = pSVar4->sel_vector;
      uVar8 = offset;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[offset];
      }
      uVar5 = *(ushort *)(pdVar2 + uVar8 * 2);
      uVar9 = (ushort)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
      if (uVar5 <= uVar9) {
        uVar9 = uVar5;
      }
      uVar1 = *(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
      *(ushort *)((long)&(stats->statistics).stats_union + 8) = uVar9;
      uVar9 = (ushort)uVar1;
      if (uVar9 <= uVar5) {
        uVar9 = uVar5;
      }
      *(ushort *)((long)&(stats->statistics).stats_union + 0x18) = uVar9;
      *(undefined2 *)pdVar10 = *(undefined2 *)(pdVar2 + uVar8 * 2);
      pdVar10 = pdVar10 + 2;
      offset = offset + 1;
    }
  }
  else {
    pdVar10 = target + target_offset * 2;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      psVar3 = adata->sel->sel_vector;
      row_idx = offset;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[offset];
      }
      bVar11 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar11) {
        uVar5 = *(ushort *)(pdVar2 + row_idx * 2);
        uVar9 = (ushort)*(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
        uVar7 = (ushort)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
        if (uVar5 <= uVar7) {
          uVar7 = uVar5;
        }
        if (uVar5 < uVar9) {
          uVar5 = uVar9;
        }
        *(ushort *)((long)&(stats->statistics).stats_union + 8) = uVar7;
        *(ushort *)((long)&(stats->statistics).stats_union + 0x18) = uVar5;
        uVar6 = *(undefined2 *)(pdVar2 + row_idx * 2);
      }
      else {
        uVar6 = 0;
      }
      *(undefined2 *)pdVar10 = uVar6;
      pdVar10 = pdVar10 + 2;
      offset = offset + 1;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}